

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O0

int dwarf_linesrc(Dwarf_Line line,char **ret_linesrc,Dwarf_Error *error)

{
  Dwarf_Error *error_local;
  char **ret_linesrc_local;
  Dwarf_Line line_local;
  
  if (line == (Dwarf_Line)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x3b);
    line_local._4_4_ = 1;
  }
  else if (line->li_context == (Dwarf_Line_Context)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x66);
    line_local._4_4_ = 1;
  }
  else {
    line_local._4_4_ =
         _dwarf_filename(line->li_context,(line->li_l_data).li_file,ret_linesrc,"dwarf_linesrc",
                         error);
  }
  return line_local._4_4_;
}

Assistant:

int
dwarf_linesrc(Dwarf_Line line, char **ret_linesrc,
    Dwarf_Error * error)
{
    if (line == NULL) {
        _dwarf_error(NULL, error, DW_DLE_DWARF_LINE_NULL);
        return DW_DLV_ERROR;
    }
    if (line->li_context == NULL) {
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_NULL);
        return DW_DLV_ERROR;
    }
    return _dwarf_filename(line->li_context,
        line->li_l_data.li_file, ret_linesrc,
        "dwarf_linesrc",error);
}